

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.cpp
# Opt level: O0

void __thiscall Interface::print_groups(Interface *this,ofstream *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  int local_44;
  undefined1 local_40 [4];
  int j;
  Group g;
  int i;
  int c;
  int b;
  int a;
  ofstream *out_local;
  Interface *this_local;
  
  uVar4 = std::ofstream::is_open();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Errors in opening");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    while( true ) {
      iVar1 = (int)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      sVar6 = std::vector<Group,_std::allocator<Group>_>::size
                        ((vector<Group,_std::allocator<Group>_> *)&this->plane);
      if ((int)sVar6 <= iVar1) break;
      iVar1 = rand();
      iVar2 = rand();
      iVar3 = rand();
      g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = iVar3 % 0x101;
      pvVar7 = std::vector<Group,_std::allocator<Group>_>::operator[]
                         ((vector<Group,_std::allocator<Group>_> *)&this->plane,
                          (long)(int)g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      Group::Group((Group *)local_40,pvVar7);
      local_44 = 0;
      while( true ) {
        sVar6 = std::vector<Point,_std::allocator<Point>_>::size
                          ((vector<Point,_std::allocator<Point>_> *)local_40);
        if ((int)sVar6 <= local_44) break;
        pvVar8 = std::vector<Point,_std::allocator<Point>_>::operator[]
                           ((vector<Point,_std::allocator<Point>_> *)local_40,(long)local_44);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)out,pvVar8->x);
        poVar5 = std::operator<<(poVar5," ");
        pvVar8 = std::vector<Point,_std::allocator<Point>_>::operator[]
                           ((vector<Point,_std::allocator<Point>_> *)local_40,(long)local_44);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar8->y);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        poVar5 = std::operator<<(poVar5," ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_44 = local_44 + 1;
      }
      Group::~Group((Group *)local_40);
      g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
    }
    std::ofstream::close();
  }
  return;
}

Assistant:

void Interface::print_groups(ofstream &out) {
    int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) plane.f.groups.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Group g = plane.f.groups[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c
                    << " " << endl;
            }


        }
        out.close();
    }
}